

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set(ArenaStringPtr *this,string *value,Arena *arena)

{
  bool bVar1;
  string *psVar2;
  string *s;
  string *current;
  ThreadSafeArena *pTStack_30;
  ScopedCheckPtrInvariants check;
  Arena *arena_local;
  string *value_local;
  ArenaStringPtr *this_local;
  
  pTStack_30 = &arena->impl_;
  anon_unknown_8::ScopedCheckPtrInvariants::ScopedCheckPtrInvariants
            ((ScopedCheckPtrInvariants *)((long)&current + 7),&this->tagged_ptr_);
  bVar1 = IsDefault(this);
  if (bVar1) {
    NewString<std::__cxx11::string>(this,(Arena *)pTStack_30,value);
  }
  else {
    bVar1 = IsFixedSizeArena(this);
    if (bVar1) {
      psVar2 = TaggedStringPtr::Get_abi_cxx11_(&this->tagged_ptr_);
      std::__cxx11::string::string((string *)psVar2,(string *)value);
      if (psVar2 != (string *)0x0) {
        ThreadSafeArena::AddCleanup
                  (pTStack_30,psVar2,cleanup::arena_destruct_object<std::__cxx11::string>);
      }
      TaggedStringPtr::SetMutableArena(&this->tagged_ptr_,psVar2);
    }
    else {
      psVar2 = UnsafeMutablePointer_abi_cxx11_(this);
      std::__cxx11::string::operator=((string *)psVar2,(string *)value);
    }
  }
  return;
}

Assistant:

void ArenaStringPtr::Set(std::string&& value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    NewString(arena, std::move(value));
  } else if (IsFixedSizeArena()) {
    std::string* current = tagged_ptr_.Get();
    auto* s = new (current) std::string(std::move(value));
    arena->OwnDestructor(s);
    tagged_ptr_.SetMutableArena(s);
  } else /* !IsFixedSizeArena() */ {
    *UnsafeMutablePointer() = std::move(value);
  }
}